

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

int_fast8_t
math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::
compare_ranges<unsigned_int*,unsigned_int*>(uint *a,uint *b,unsigned_fast_type count)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  lVar3 = count << 2;
  do {
    if (lVar3 == 0) {
      return '\0';
    }
    uVar1 = *(uint *)((long)a + lVar3 + -4);
    uVar2 = *(uint *)((long)b + lVar3 + -4);
    lVar3 = lVar3 + -4;
  } while (uVar1 == uVar2);
  return (uVar2 < uVar1) - 1U | 1;
}

Assistant:

static constexpr auto compare_ranges(      InputIteratorLeftType  a,
                                               InputIteratorRightType b,
                                         const unsigned_fast_type     count) -> std::int_fast8_t
    {
      auto n_return = static_cast<std::int_fast8_t>(INT8_C(0));

      detail::iterator_detail::reverse_iterator<InputIteratorLeftType>  pa(detail::advance_and_point(a, count));
      detail::iterator_detail::reverse_iterator<InputIteratorRightType> pb(detail::advance_and_point(b, count));

      while(pa != detail::iterator_detail::reverse_iterator<InputIteratorLeftType>(a)) // NOLINT(altera-id-dependent-backward-branch)
      {
        using value_left_type = typename detail::iterator_detail::iterator_traits<InputIteratorLeftType>::value_type;

        const auto value_a = *pa++;
        const auto value_b = static_cast<value_left_type>(*pb++);

        if(value_a != value_b)
        {
          n_return =
            static_cast<std::int_fast8_t>
            (
              (value_a > value_b)
                ? static_cast<std::int_fast8_t>(INT8_C(1))
                : static_cast<std::int_fast8_t>(INT8_C(-1))
            );

          break;
        }
      }

      return n_return;
    }